

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

string * __thiscall arangodb::velocypack::Builder::toJson_abi_cxx11_(Builder *this)

{
  Slice slice;
  Options *in_RSI;
  string *in_RDI;
  StringSink sink;
  string *buffer;
  Builder *in_stack_ffffffffffffff98;
  StringSinkImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa0;
  string *sink_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  sink_00 = in_RDI;
  std::__cxx11::string::string(in_stack_ffffffffffffffc0);
  StringSinkImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  StringSinkImpl(in_stack_ffffffffffffffa0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff98);
  slice = Builder::slice(in_stack_ffffffffffffff98);
  Dumper::dump(slice,(Sink *)sink_00,in_RSI);
  return in_RDI;
}

Assistant:

std::string Builder::toJson() const {
  std::string buffer;
  StringSink sink(&buffer);
  Dumper::dump(slice(), &sink);
  return buffer;
}